

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

CharPtr __thiscall
fmt::BasicWriter<char>::write_str<char>(BasicWriter<char> *this,char *s,size_t size,AlignSpec *spec)

{
  char cVar1;
  uint uVar2;
  wchar_t value;
  Alignment AVar3;
  BasicWriter<char> *__first;
  BasicWriter<char> *pBVar4;
  AlignSpec *in_RCX;
  ulong in_RDX;
  undefined8 in_RDI;
  char fill;
  CharPtr out;
  CharPtr in_stack_ffffffffffffffb0;
  BasicWriter<char> *in_stack_ffffffffffffffb8;
  BasicWriter<char> *in_stack_ffffffffffffffc0;
  wchar_t fill_00;
  undefined7 in_stack_ffffffffffffffd0;
  
  fill_00 = (wchar_t)((ulong)in_RDI >> 0x20);
  uVar2 = WidthSpec::width(&in_RCX->super_WidthSpec);
  if (in_RDX < uVar2) {
    WidthSpec::width(&in_RCX->super_WidthSpec);
    __first = (BasicWriter<char> *)
              grow_buffer(in_stack_ffffffffffffffc0,(size_t)in_stack_ffffffffffffffb8);
    value = WidthSpec::fill(&in_RCX->super_WidthSpec);
    cVar1 = internal::BasicCharTraits<char>::cast(value);
    AVar3 = AlignSpec::align(in_RCX);
    if (AVar3 == ALIGN_RIGHT) {
      pBVar4 = __first;
      WidthSpec::width(&in_RCX->super_WidthSpec);
      std::uninitialized_fill_n<char*,unsigned_long,char>
                ((char *)__first,(unsigned_long)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0)
      ;
      uVar2 = WidthSpec::width(&in_RCX->super_WidthSpec);
      in_stack_ffffffffffffffc0 = __first;
      __first = (BasicWriter<char> *)((uVar2 - in_RDX) + (long)pBVar4);
    }
    else {
      AVar3 = AlignSpec::align(in_RCX);
      if (AVar3 == ALIGN_CENTER) {
        pBVar4 = __first;
        WidthSpec::width(&in_RCX->super_WidthSpec);
        pBVar4 = (BasicWriter<char> *)
                 fill_padding((CharPtr)in_RCX,(uint)((ulong)pBVar4 >> 0x20),
                              CONCAT17(cVar1,in_stack_ffffffffffffffd0),fill_00);
        in_stack_ffffffffffffffb8 = __first;
        __first = pBVar4;
      }
      else {
        in_stack_ffffffffffffffb0 = (CharPtr)((long)&__first->_vptr_BasicWriter + in_RDX);
        WidthSpec::width(&in_RCX->super_WidthSpec);
        std::uninitialized_fill_n<char*,unsigned_long,char>
                  ((char *)in_stack_ffffffffffffffc0,(unsigned_long)in_stack_ffffffffffffffb8,
                   in_stack_ffffffffffffffb0);
      }
    }
  }
  else {
    __first = (BasicWriter<char> *)
              grow_buffer(in_stack_ffffffffffffffc0,(size_t)in_stack_ffffffffffffffb8);
  }
  std::uninitialized_copy<char_const*,char*>
            ((char *)in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8,
             in_stack_ffffffffffffffb0);
  return (CharPtr)__first;
}

Assistant:

typename BasicWriter<Char>::CharPtr BasicWriter<Char>::write_str(
      const StrChar *s, std::size_t size, const AlignSpec &spec) {
  CharPtr out = CharPtr();
  if (spec.width() > size) {
    out = grow_buffer(spec.width());
    Char fill = internal::CharTraits<Char>::cast(spec.fill());
    if (spec.align() == ALIGN_RIGHT) {
      std::uninitialized_fill_n(out, spec.width() - size, fill);
      out += spec.width() - size;
    } else if (spec.align() == ALIGN_CENTER) {
      out = fill_padding(out, spec.width(), size, fill);
    } else {
      std::uninitialized_fill_n(out + size, spec.width() - size, fill);
    }
  } else {
    out = grow_buffer(size);
  }
  std::uninitialized_copy(s, s + size, out);
  return out;
}